

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_decoding.cc
# Opt level: O0

bool draco::DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<18>>
               (uint32_t num_values,DecoderBuffer *src_buffer,uint32_t *out_values)

{
  undefined1 uVar1;
  bool bVar2;
  uint32_t uVar3;
  long in_RDX;
  uint in_EDI;
  uint32_t value;
  uint32_t i;
  RAnsSymbolDecoder<18> decoder;
  undefined4 in_stack_ffffffffffffff50;
  uint32_t in_stack_ffffffffffffff54;
  RAnsSymbolDecoder<18> *this;
  undefined7 in_stack_ffffffffffffff68;
  uint local_8c;
  DecoderBuffer *in_stack_ffffffffffffff90;
  RAnsSymbolDecoder<18> *in_stack_ffffffffffffff98;
  bool local_1;
  
  this = (RAnsSymbolDecoder<18> *)&stack0xffffffffffffff88;
  RAnsSymbolDecoder<18>::RAnsSymbolDecoder(this);
  uVar1 = RAnsSymbolDecoder<18>::Create(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  if ((bool)uVar1) {
    if (in_EDI != 0) {
      uVar3 = RAnsSymbolDecoder<18>::num_symbols((RAnsSymbolDecoder<18> *)&stack0xffffffffffffff88);
      if (uVar3 == 0) {
        local_1 = false;
        goto LAB_001fd086;
      }
    }
    bVar2 = RAnsSymbolDecoder<18>::StartDecoding
                      ((RAnsSymbolDecoder<18> *)CONCAT17(uVar1,in_stack_ffffffffffffff68),
                       (DecoderBuffer *)this);
    if (bVar2) {
      for (local_8c = 0; local_8c < in_EDI; local_8c = local_8c + 1) {
        in_stack_ffffffffffffff54 =
             RAnsSymbolDecoder<18>::DecodeSymbol((RAnsSymbolDecoder<18> *)0x1fd03c);
        *(uint32_t *)(in_RDX + (ulong)local_8c * 4) = in_stack_ffffffffffffff54;
      }
      RAnsSymbolDecoder<18>::EndDecoding((RAnsSymbolDecoder<18> *)0x1fd074);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
LAB_001fd086:
  RAnsSymbolDecoder<18>::~RAnsSymbolDecoder
            ((RAnsSymbolDecoder<18> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50))
  ;
  return local_1;
}

Assistant:

bool DecodeRawSymbolsInternal(uint32_t num_values, DecoderBuffer *src_buffer,
                              uint32_t *out_values) {
  SymbolDecoderT decoder;
  if (!decoder.Create(src_buffer)) {
    return false;
  }

  if (num_values > 0 && decoder.num_symbols() == 0) {
    return false;  // Wrong number of symbols.
  }

  if (!decoder.StartDecoding(src_buffer)) {
    return false;
  }
  for (uint32_t i = 0; i < num_values; ++i) {
    // Decode a symbol into the value.
    const uint32_t value = decoder.DecodeSymbol();
    out_values[i] = value;
  }
  decoder.EndDecoding();
  return true;
}